

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumBilerpTexture::Evaluate
          (SpectrumBilerpTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_class_24_3_48d30edf func;
  float fVar8;
  float fVar15;
  undefined1 auVar10 [64];
  undefined1 auVar16 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar21 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  SampledSpectrum SVar22;
  Tuple3<pbrt::Point3,_float> *local_120;
  undefined8 **ppuStack_118;
  Vector2f **local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Tuple2<pbrt::Vector2,_float> local_88;
  undefined8 local_80;
  Tuple2<pbrt::Vector2,_float> *local_78;
  undefined8 *local_70;
  Tuple3<pbrt::Point3,_float> local_68 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_50 [4];
  undefined1 auVar11 [64];
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 auVar17 [64];
  
  local_70 = &local_80;
  local_78 = &local_88;
  local_120 = local_68;
  local_80 = 0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  ppuStack_118 = &local_70;
  local_110 = (Vector2f **)&local_78;
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  aTStack_50[3].x = (float)ctx.faceIndex;
  func.dstdx = (Vector2f **)ppuStack_118;
  func.ctx = (TextureEvalContext *)local_120;
  func.dstdy = local_110;
  auVar10._0_8_ =
       TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
       ::
       Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                 ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   *)this,func);
  auVar10._8_56_ = extraout_var;
  local_68[0]._0_8_ =
       (this->v00).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  local_a8 = auVar10._0_16_;
  local_98 = vmovshdup_avx(local_a8);
  auVar21 = ZEXT856(local_98._8_8_);
  auVar16 = extraout_var;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_120,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar17._0_8_ = SVar22.values.values._8_8_;
  auVar17._8_56_ = auVar21;
  auVar11._0_8_ = SVar22.values.values._0_8_;
  auVar11._8_56_ = auVar16;
  local_68[0]._0_8_ =
       (this->v10).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  local_b8 = auVar11._0_16_;
  local_c8 = auVar17._0_16_;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_120,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar18._0_8_ = SVar22.values.values._8_8_;
  auVar18._8_56_ = auVar21;
  auVar12._0_8_ = SVar22.values.values._0_8_;
  auVar12._8_56_ = auVar16;
  local_68[0]._0_8_ =
       (this->v01).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  local_d8 = auVar12._0_16_;
  local_e8 = auVar18._0_16_;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_120,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar19._0_8_ = SVar22.values.values._8_8_;
  auVar19._8_56_ = auVar21;
  auVar13._0_8_ = SVar22.values.values._0_8_;
  auVar13._8_56_ = auVar16;
  local_68[0]._0_8_ =
       (this->v11).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  local_f8 = auVar13._0_16_;
  local_108 = auVar19._0_16_;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_120,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar20._0_8_ = SVar22.values.values._8_8_;
  auVar20._8_56_ = auVar21;
  auVar14._0_8_ = SVar22.values.values._0_8_;
  auVar14._8_56_ = auVar16;
  auVar9 = vmovlhps_avx(auVar14._0_16_,auVar20._0_16_);
  auVar5 = vunpcklpd_avx(local_b8,local_c8);
  fVar1 = (float)local_a8._0_4_ * (float)local_98._0_4_;
  fVar2 = (1.0 - (float)local_a8._0_4_) * (1.0 - (float)local_98._0_4_);
  fVar3 = (float)local_a8._0_4_ * (1.0 - (float)local_98._0_4_);
  fVar4 = (float)local_98._0_4_ * (1.0 - (float)local_a8._0_4_);
  auVar6 = vunpcklpd_avx(local_d8,local_e8);
  auVar7 = vunpcklpd_avx(local_f8,local_108);
  fVar8 = fVar1 * auVar9._0_4_ + fVar4 * auVar7._0_4_ + fVar3 * auVar6._0_4_ + fVar2 * auVar5._0_4_;
  fVar15 = fVar1 * auVar9._4_4_ + fVar4 * auVar7._4_4_ + fVar3 * auVar6._4_4_ + fVar2 * auVar5._4_4_
  ;
  auVar9 = CONCAT412(fVar1 * auVar9._12_4_ +
                     fVar4 * auVar7._12_4_ + fVar3 * auVar6._12_4_ + fVar2 * auVar5._12_4_,
                     CONCAT48(fVar1 * auVar9._8_4_ +
                              fVar4 * auVar7._8_4_ + fVar3 * auVar6._8_4_ + fVar2 * auVar5._8_4_,
                              CONCAT44(fVar15,fVar8)));
  auVar9 = vshufpd_avx(auVar9,auVar9,1);
  SVar22.values.values._8_8_ = auVar9._0_8_;
  SVar22.values.values[0] = fVar8;
  SVar22.values.values[1] = fVar15;
  return (SampledSpectrum)SVar22.values.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Bilerp({st[0], st[1]}, {v00.Sample(lambda), v10.Sample(lambda),
                                       v01.Sample(lambda), v11.Sample(lambda)});
    }